

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *ec)

{
  pointer *ppuVar1;
  iterator iVar2;
  pointer puVar3;
  pointer puVar4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  uint8_t code;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  ulong uVar10;
  bson_errc __e;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  difference_type __offset;
  ulong uVar14;
  type tVar15;
  decimal128_from_chars_result dVar16;
  value_type_conflict b;
  oid_t oid;
  uchar local_59;
  decimal128_t local_58;
  string_view_type *local_48;
  pointer local_40;
  pointer local_38;
  
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __e = expected_bson_document;
    goto LAB_00222b63;
  }
  if (tag < regex) {
    if (tag == float128) {
      before_value(this,'\x13');
      local_58.low = 0;
      local_58.high = 0;
      dVar16 = decimal128_from_chars(sv->_M_str,sv->_M_str + sv->_M_len,&local_58);
      if (dVar16.ec == 0) {
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (local_58.low,
                   (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )&this->buffer_);
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (local_58.high,
                   (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )&this->buffer_);
        return true;
      }
      __e = invalid_decimal128_string;
      goto LAB_00222b63;
    }
    if (tag == id) {
      before_value(this,'\a');
      oid_t::oid_t((oid_t *)&local_58,sv);
      lVar11 = 0;
      do {
        local_59 = *(uchar *)((long)&local_58.low + lVar11);
        iVar2._M_current =
             (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,iVar2,
                     &local_59);
        }
        else {
          *iVar2._M_current = local_59;
          ppuVar1 = &(this->buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0xc);
      return true;
    }
LAB_002228fb:
    code = '\x02';
  }
  else {
    if (tag == regex) {
      before_value(this,'\v');
      uVar10 = sv->_M_len;
      uVar8 = 0xffffffffffffffff;
      if (uVar10 == 0) {
LAB_00222a81:
        uVar14 = 0xffffffffffffffff;
      }
      else {
        pcVar6 = sv->_M_str;
        pvVar7 = memchr(pcVar6,0x2f,uVar10);
        uVar8 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar6;
        uVar12 = uVar10;
        do {
          uVar14 = uVar12 - 1;
          if (uVar12 == 0) goto LAB_00222a81;
          lVar11 = uVar12 - 1;
          uVar12 = uVar14;
        } while (sv->_M_str[lVar11] != '/');
      }
      if (((uVar8 != uVar14) && (uVar8 != 0xffffffffffffffff)) && (uVar14 != 0xffffffffffffffff)) {
        uVar12 = uVar8 + 1;
        local_48 = sv;
        if (uVar8 < uVar10) {
          uVar8 = uVar10 - uVar12;
          if (uVar14 - 1 <= uVar10 - uVar12) {
            uVar8 = uVar14 - 1;
          }
          if (uVar8 != 0) {
            pcVar6 = sv->_M_str;
            uVar10 = 0;
            do {
              local_58.low = CONCAT71(local_58.low._1_7_,pcVar6[uVar10 + uVar12]);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(&this->buffer_,(uchar *)&local_58);
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
          pvVar9 = &this->buffer_;
          local_58.low = local_58.low & 0xffffffffffffff00;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (pvVar9,(uchar *)&local_58);
          uVar12 = uVar14 + 1;
          uVar10 = local_48->_M_len;
          if (uVar14 < uVar10) {
            if (uVar12 != uVar10) {
              pcVar6 = local_48->_M_str;
              do {
                local_58.low = CONCAT71(local_58.low._1_7_,pcVar6[uVar12]);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(pvVar9,(uchar *)&local_58);
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            local_58.low = local_58.low & 0xffffffffffffff00;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar9,(uchar *)&local_58);
            return true;
          }
        }
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar12,uVar10);
      }
      __e = invalid_regex_string;
      goto LAB_00222b63;
    }
    code = '\r';
    if (tag != code) goto LAB_002228fb;
  }
  local_48 = (string_view_type *)ec;
  before_value(this,code);
  pvVar9 = &this->buffer_;
  iVar2._M_current =
       (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar11 = (long)iVar2._M_current -
           (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  local_58.low = local_58.low & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (pvVar9,iVar2,4,(value_type_conflict *)&local_58);
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  tVar15 = unicode_traits::validate<char>(sv->_M_str,sv->_M_len);
  if (tVar15.ec == success) {
    sVar5 = sv->_M_len;
    local_48 = (string_view_type *)lVar11;
    local_40 = puVar4;
    local_38 = puVar3;
    if (sVar5 != 0) {
      pcVar6 = sv->_M_str;
      sVar13 = 0;
      do {
        local_58.low = CONCAT71(local_58.low._1_7_,pcVar6[sVar13]);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar9,(uchar *)&local_58);
        sVar13 = sVar13 + 1;
      } while (sVar5 != sVar13);
    }
    local_58.low = local_58.low & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (pvVar9,(uchar *)&local_58);
    puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(int *)(puVar3 + (long)local_48) =
         ((int)local_38 +
         *(int *)&(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish) - ((int)local_40 + (int)puVar3);
    return true;
  }
  __e = invalid_utf8_text_string;
  ec = (error_code *)local_48;
LAB_00222b63:
  std::error_code::operator=(ec,__e);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }

        switch (tag)
        {
            case semantic_tag::float128:
            {
                before_value(jsoncons::bson::bson_type::decimal128_type);
                decimal128_t dec;
                auto rc = decimal128_from_chars(sv.data(), sv.data()+sv.size(), dec);
                if (rc.ec != std::errc())
                {
                    ec = bson_errc::invalid_decimal128_string;
                    JSONCONS_VISITOR_RETURN;
                }
                binary::native_to_little(dec.low,std::back_inserter(buffer_));
                binary::native_to_little(dec.high,std::back_inserter(buffer_));
                break;
            }
            case semantic_tag::id:
            {
                before_value(jsoncons::bson::bson_type::object_id_type);
                oid_t oid(sv);
                for (auto b : oid)
                {
                    buffer_.push_back(b);
                }
                break;
            }
            case semantic_tag::regex:
            {
                before_value(jsoncons::bson::bson_type::regex_type);
                std::size_t first = sv.find_first_of('/');
                std::size_t last = sv.find_last_of('/');
                if (first == string_view::npos || last == string_view::npos || first == last)
                {
                    ec = bson_errc::invalid_regex_string;
                    JSONCONS_VISITOR_RETURN;
                }
                string_view regex = sv.substr(first+1,last-1);
                for (auto c : regex)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                string_view options = sv.substr(last+1);
                for (auto c : options)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                break;
            }
            default:
                switch (tag)
                {
                    case semantic_tag::code:
                        before_value(jsoncons::bson::bson_type::javascript_type);
                        break;
                    default:
                        before_value(jsoncons::bson::bson_type::string_type);
                        break;
                }
                std::size_t offset = buffer_.size();
                buffer_.insert(buffer_.end(), sizeof(int32_t), 0);
                std::size_t string_offset = buffer_.size();
                auto sink = unicode_traits::validate(sv.data(), sv.size());
                if (sink.ec != unicode_traits::conv_errc())
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    JSONCONS_VISITOR_RETURN;
                }
                for (auto c : sv)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                std::size_t length = buffer_.size() - string_offset;
                binary::native_to_little(static_cast<uint32_t>(length), buffer_.begin()+offset);
                break;
        }

        JSONCONS_VISITOR_RETURN;
    }